

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O2

void __thiscall glslang::TIntermBinary::updatePrecision(TIntermBinary *this)

{
  undefined8 uVar1;
  TIntermTyped *pTVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  uint uVar4;
  uint uVar5;
  
  iVar3 = (*(this->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x20])();
  if (((iVar3 != 8) &&
      (iVar3 = (*(this->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                 _vptr_TIntermNode[0x20])(this), iVar3 != 9)) &&
     (iVar3 = (*(this->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
                [0x20])(this), iVar3 != 1)) {
    return;
  }
  if (((this->super_TIntermOperator).op & ~EOpSequence) == EOpRightShift) {
    iVar3 = (*(this->left->super_TIntermNode)._vptr_TIntermNode[0x21])();
    uVar1 = *(undefined8 *)(CONCAT44(extraout_var,iVar3) + 8);
    iVar3 = (*(this->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x21])(this);
    *(ulong *)(CONCAT44(extraout_var_00,iVar3) + 8) =
         *(ulong *)(CONCAT44(extraout_var_00,iVar3) + 8) & 0xfffffffff1ffffff |
         (ulong)((uint)uVar1 & 0xe000000);
  }
  else {
    iVar3 = (*(this->right->super_TIntermNode)._vptr_TIntermNode[0x21])();
    uVar4 = *(uint *)(CONCAT44(extraout_var_01,iVar3) + 8) >> 0x19 & 7;
    iVar3 = (*(this->left->super_TIntermNode)._vptr_TIntermNode[0x21])();
    uVar5 = *(uint *)(CONCAT44(extraout_var_02,iVar3) + 8) >> 0x19 & 7;
    if (uVar5 < uVar4) {
      uVar5 = uVar4;
    }
    iVar3 = (*(this->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x21])(this);
    *(ulong *)(CONCAT44(extraout_var_03,iVar3) + 8) =
         *(ulong *)(CONCAT44(extraout_var_03,iVar3) + 8) & 0xfffffffff1ffffff |
         (ulong)(uVar5 << 0x19);
    iVar3 = (*(this->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x21])(this);
    if ((*(byte *)(CONCAT44(extraout_var_04,iVar3) + 0xb) & 0xe) != 0) {
      pTVar2 = this->left;
      iVar3 = (*(this->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
                [0x21])(this);
      (*(pTVar2->super_TIntermNode)._vptr_TIntermNode[0x25])
                (pTVar2,(ulong)(*(uint *)(CONCAT44(extraout_var_05,iVar3) + 8) >> 0x19 & 7));
      pTVar2 = this->right;
      iVar3 = (*(this->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
                [0x21])(this);
      (*(pTVar2->super_TIntermNode)._vptr_TIntermNode[0x25])
                (pTVar2,(ulong)(*(uint *)(CONCAT44(extraout_var_06,iVar3) + 8) >> 0x19 & 7));
      return;
    }
  }
  return;
}

Assistant:

void TIntermBinary::updatePrecision()
{
     if (getBasicType() == EbtInt || getBasicType() == EbtUint ||
         getBasicType() == EbtFloat) {
       if (op == EOpRightShift || op == EOpLeftShift) {
         // For shifts get precision from left side only and thus no need to propagate
         getQualifier().precision = left->getQualifier().precision;
       } else {
         getQualifier().precision = std::max(right->getQualifier().precision, left->getQualifier().precision);
         if (getQualifier().precision != EpqNone) {
           left->propagatePrecision(getQualifier().precision);
           right->propagatePrecision(getQualifier().precision);
         }
       }
    }
}